

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_huffman_block(stbi__zbuf *a)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  int local_38;
  int iStack_34;
  stbi_uc v;
  int dist;
  int len;
  stbi_uc *p;
  char *pcStack_20;
  int z;
  char *zout;
  stbi__zbuf *a_local;
  
  pcStack_20 = a->zout;
  while( true ) {
    while (iVar2 = stbi__zhuffman_decode(a,&a->z_length), iVar2 < 0x100) {
      if (iVar2 < 0) {
        iVar2 = stbi__err("Corrupt PNG");
        return iVar2;
      }
      if (a->zout_end <= pcStack_20) {
        iVar3 = stbi__zexpand(a,pcStack_20,1);
        if (iVar3 == 0) {
          return 0;
        }
        pcStack_20 = a->zout;
      }
      *pcStack_20 = (char)iVar2;
      pcStack_20 = pcStack_20 + 1;
    }
    if (iVar2 == 0x100) break;
    if (0x11d < iVar2) {
      iVar2 = stbi__err("Corrupt PNG");
      return iVar2;
    }
    iVar2 = iVar2 + -0x101;
    iStack_34 = stbi__zlength_base[iVar2];
    if (stbi__zlength_extra[iVar2] != 0) {
      uVar4 = stbi__zreceive(a,stbi__zlength_extra[iVar2]);
      iStack_34 = uVar4 + iStack_34;
    }
    iVar2 = stbi__zhuffman_decode(a,&a->z_distance);
    if ((iVar2 < 0) || (0x1d < iVar2)) {
      iVar2 = stbi__err("Corrupt PNG");
      return iVar2;
    }
    local_38 = stbi__zdist_base[iVar2];
    if (stbi__zdist_extra[iVar2] != 0) {
      uVar4 = stbi__zreceive(a,stbi__zdist_extra[iVar2]);
      local_38 = uVar4 + local_38;
    }
    if ((long)pcStack_20 - (long)a->zout_start < (long)local_38) {
      iVar2 = stbi__err("Corrupt PNG");
      return iVar2;
    }
    if ((long)a->zout_end - (long)pcStack_20 < (long)iStack_34) {
      iVar2 = stbi__zexpand(a,pcStack_20,iStack_34);
      if (iVar2 == 0) {
        return 0;
      }
      pcStack_20 = a->zout;
    }
    pcVar5 = pcStack_20 + -(long)local_38;
    if (local_38 == 1) {
      cVar1 = *pcVar5;
      for (; iStack_34 != 0; iStack_34 = iStack_34 + -1) {
        *pcStack_20 = cVar1;
        pcStack_20 = pcStack_20 + 1;
      }
    }
    else {
      for (; iStack_34 != 0; iStack_34 = iStack_34 + -1) {
        *pcStack_20 = *pcVar5;
        pcVar5 = pcVar5 + 1;
        pcStack_20 = pcStack_20 + 1;
      }
    }
  }
  a->zout = pcStack_20;
  if ((a->hit_zeof_once != 0) && (a->num_bits < 0x10)) {
    iVar2 = stbi__err("Corrupt PNG");
    return iVar2;
  }
  return 1;
}

Assistant:

static int stbi__parse_huffman_block(stbi__zbuf *a)
{
   char *zout = a->zout;
   for(;;) {
      int z = stbi__zhuffman_decode(a, &a->z_length);
      if (z < 256) {
         if (z < 0) return stbi__err("bad huffman code","Corrupt PNG"); // error in huffman codes
         if (zout >= a->zout_end) {
            if (!stbi__zexpand(a, zout, 1)) return 0;
            zout = a->zout;
         }
         *zout++ = (char) z;
      } else {
         stbi_uc *p;
         int len,dist;
         if (z == 256) {
            a->zout = zout;
            if (a->hit_zeof_once && a->num_bits < 16) {
               // The first time we hit zeof, we inserted 16 extra zero bits into our bit
               // buffer so the decoder can just do its speculative decoding. But if we
               // actually consumed any of those bits (which is the case when num_bits < 16),
               // the stream actually read past the end so it is malformed.
               return stbi__err("unexpected end","Corrupt PNG");
            }
            return 1;
         }
         if (z >= 286) return stbi__err("bad huffman code","Corrupt PNG"); // per DEFLATE, length codes 286 and 287 must not appear in compressed data
         z -= 257;
         len = stbi__zlength_base[z];
         if (stbi__zlength_extra[z]) len += stbi__zreceive(a, stbi__zlength_extra[z]);
         z = stbi__zhuffman_decode(a, &a->z_distance);
         if (z < 0 || z >= 30) return stbi__err("bad huffman code","Corrupt PNG"); // per DEFLATE, distance codes 30 and 31 must not appear in compressed data
         dist = stbi__zdist_base[z];
         if (stbi__zdist_extra[z]) dist += stbi__zreceive(a, stbi__zdist_extra[z]);
         if (zout - a->zout_start < dist) return stbi__err("bad dist","Corrupt PNG");
         if (len > a->zout_end - zout) {
            if (!stbi__zexpand(a, zout, len)) return 0;
            zout = a->zout;
         }
         p = (stbi_uc *) (zout - dist);
         if (dist == 1) { // run of one byte; common in images.
            stbi_uc v = *p;
            if (len) { do *zout++ = v; while (--len); }
         } else {
            if (len) { do *zout++ = *p++; while (--len); }
         }
      }
   }
}